

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O0

void __thiscall
stackjit::ExecutionEngine::loadImage
          (ExecutionEngine *this,AssemblyImage *image,AssemblyType assemblyType)

{
  Function *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  size_type sVar1;
  runtime_error *prVar2;
  __type local_139;
  undefined1 local_110 [103];
  byte local_a9;
  TypeSystem local_a8 [39];
  byte local_81;
  undefined1 local_80 [56];
  string local_48 [32];
  __node_base local_28;
  Function *mainFunc;
  AssemblyImage *pAStack_18;
  AssemblyType assemblyType_local;
  AssemblyImage *image_local;
  ExecutionEngine *this_local;
  
  mainFunc._4_4_ = assemblyType;
  pAStack_18 = image;
  image_local = (AssemblyImage *)this;
  if (assemblyType == Program) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"main",(allocator *)(local_80 + 0x37));
    this_00 = getFunction(image,(string *)local_48);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)(local_80 + 0x37));
    local_28._M_nxt = (_Hash_node_base *)this_00;
    if (this_00 == (Function *)0x0) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar2,"The main function must be defined.");
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this_01 = Loader::Function::parameters_abi_cxx11_(this_00);
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(this_01);
    local_81 = 0;
    local_a9 = 0;
    local_139 = false;
    if (sVar1 == 0) {
      Loader::Function::returnType_abi_cxx11_((Function *)local_80);
      local_81 = 1;
      TypeSystem::toString_abi_cxx11_(local_a8,Integer);
      local_a9 = 1;
      local_139 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_80,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_a8);
    }
    if ((local_a9 & 1) != 0) {
      std::__cxx11::string::~string((string *)local_a8);
    }
    if ((local_81 & 1) != 0) {
      std::__cxx11::string::~string((string *)local_80);
    }
    if (((local_139 ^ 0xffU) & 1) != 0) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      Loader::Function::toString_abi_cxx11_((Function *)local_110);
      std::operator+(local_110 + 0x20,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "The main function must have the signature: \'main() Int\' but got \'");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_110 + 0x40),local_110 + 0x20);
      std::runtime_error::runtime_error(prVar2,(string *)(local_110 + 0x40));
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  ImageContainer::addImage(&this->mImageContainer,pAStack_18);
  return;
}

Assistant:

void ExecutionEngine::loadImage(AssemblyImage* image, AssemblyType assemblyType) {
		if (assemblyType == AssemblyType::Program) {
			auto mainFunc = getFunction(*image, "main");

			if (mainFunc != nullptr) {
				if (!(mainFunc->parameters().size() == 0
					  && mainFunc->returnType() == TypeSystem::toString(PrimitiveTypes::Integer))) {
					throw std::runtime_error("The main function must have the signature: 'main() Int' but got '" + mainFunc->toString() + "'.");
				}
			} else {
				throw std::runtime_error("The main function must be defined.");
			}
		}

		mImageContainer.addImage(image);
	}